

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

string * __thiscall
lan::db::write_all_bits_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bits *bits)

{
  string local_60;
  allocator<char> local_2a;
  undefined1 local_29;
  db_bits *local_28;
  db_bit *buffer;
  db_bits *bits_local;
  db *this_local;
  string *bits_str;
  
  local_29 = 0;
  local_28 = bits;
  buffer = bits;
  bits_local = (db_bits *)this;
  this_local = (db *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  for (; local_28 != (db_bit *)0x0; local_28 = local_28->nex) {
    write_bit_abi_cxx11_(&local_60,this,local_28,false);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_all_bits(db_bits * bits){
            db_bit * buffer = bits;
            std::string bits_str = "";
            while(buffer){
                bits_str += write_bit(buffer);
                buffer = buffer->nex;
            }
            return bits_str;
        }